

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::getEOSNode
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,
          Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  size_t sVar1;
  mecab_node_t *pmVar2;
  
  pmVar2 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
  pmVar2->prev = (mecab_node_t *)0x0;
  pmVar2->next = (mecab_node_t *)0x0;
  pmVar2->enext = (mecab_node_t *)0x0;
  pmVar2->bnext = (mecab_node_t *)0x0;
  pmVar2->rpath = (mecab_path_t *)0x0;
  pmVar2->lpath = (mecab_path_t *)0x0;
  pmVar2->surface = (char *)0x0;
  pmVar2->feature = (char *)0x0;
  pmVar2->id = 0;
  pmVar2->length = 0;
  pmVar2->rlength = 0;
  pmVar2->rcAttr = 0;
  pmVar2->lcAttr = 0;
  pmVar2->posid = 0;
  pmVar2->char_type = '\0';
  pmVar2->stat = '\0';
  pmVar2->isbest = '\0';
  *(undefined3 *)&pmVar2->field_0x51 = 0;
  pmVar2->alpha = 0.0;
  pmVar2->beta = 0.0;
  pmVar2->prob = 0.0;
  *(undefined8 *)&pmVar2->wcost = 0;
  pmVar2->cost = 0;
  sVar1 = allocator->id_;
  allocator->id_ = sVar1 + 1;
  pmVar2->id = (uint)sVar1;
  pmVar2->surface = "BOS/EOS";
  pmVar2->feature = (this->bos_feature_).super_scoped_array<char>.ptr_;
  pmVar2->stat = '\x03';
  pmVar2->isbest = '\x01';
  return pmVar2;
}

Assistant:

N *Tokenizer<N, P>::getEOSNode(Allocator<N, P> *allocator) const {
  N *eos_node = getBOSNode(allocator);  // same
  eos_node->stat = MECAB_EOS_NODE;
  return eos_node;
}